

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsk.cpp
# Opt level: O1

bool WriteDSK(FILE *f_,shared_ptr<Disk> *disk)

{
  undefined4 uVar1;
  pointer __src;
  byte bVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  char *__src_00;
  bool bVar5;
  uint8_t uVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  int iVar10;
  uint uVar11;
  int iVar12;
  uint uVar13;
  uint uVar14;
  int iVar15;
  Track *this;
  Sector *pSVar16;
  Data *pDVar17;
  long lVar18;
  uint8_t *puVar19;
  undefined7 uVar22;
  size_t sVar20;
  exception *peVar21;
  unsigned_short uVar23;
  byte bVar24;
  DataRate datarate;
  uint8_t *puVar25;
  uint8_t *__dest;
  int track_size;
  vector<unsigned_short,_std::allocator<unsigned_short>_> offsets;
  Sector sector;
  CylHead cylhead;
  Sector typical;
  byte local_266;
  uint local_264;
  uint8_t *local_260;
  uint local_254;
  byte local_24d;
  uint local_24c;
  uint local_248;
  uint local_244;
  uint local_240;
  uint local_23c;
  char *local_238;
  undefined8 uStack_230;
  vector<unsigned_short,_std::allocator<unsigned_short>_> local_228;
  Track *local_210;
  Sector local_208;
  uint8_t *local_1c0;
  uint local_1b8;
  uint local_1b4;
  CylHead local_1b0;
  ulong local_1a8;
  undefined1 *local_1a0;
  shared_ptr<Disk> *local_198;
  uint8_t *local_190;
  FILE *local_188;
  uint8_t *local_180;
  undefined1 local_178 [40];
  vector<Data,_std::allocator<Data>_> local_150;
  char local_138 [48];
  byte local_108;
  byte local_107;
  undefined1 local_104 [212];
  
  local_260 = AllocMem(0xff00);
  memset(local_138 + 0x22,0,0xde);
  builtin_strncpy(local_138,"EXTENDED CPC DSK File\r\nDisk-Info\r\n",0x22);
  util::fmt_abi_cxx11_((string *)local_178,"SAMdisk%02u%02u%02u",0x19,4);
  __src_00 = (char *)CONCAT17(local_178[7],CONCAT52(local_178._2_5_,local_178._0_2_));
  strncpy(local_138 + 0x22,__src_00,0xe);
  if (__src_00 != local_178 + 0x10) {
    operator_delete(__src_00,local_178._16_8_ + 1);
  }
  iVar10 = Disk::cyls((disk->super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  local_108 = (byte)iVar10;
  uVar11 = Disk::heads((disk->super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  local_107 = (byte)uVar11;
  if ((ulong)local_108 < 0x67) {
    if ((uVar11 & 0xff) < 3) {
      local_228.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_228.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_finish = (unsigned_short *)0x0;
      local_228.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (unsigned_short *)0x0;
      std::vector<unsigned_short,_std::allocator<unsigned_short>_>::reserve
                (&local_228,(ulong)(uVar11 & 0xff) * ((ulong)local_108 + 1));
      local_1a8 = 0;
      fseek((FILE *)f_,0x100,0);
      if (local_108 != 0) {
        local_1a0 = local_104;
        local_190 = local_260 + 0xd;
        local_266 = 1;
        local_254 = 0;
        local_198 = disk;
        local_188 = (FILE *)f_;
        do {
          if (local_107 != 0) {
            uVar11 = 0;
            do {
              local_24c = uVar11;
              CylHead::CylHead(&local_1b0,local_254,local_24c);
              this = Disk::read_track((disk->super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>).
                                      _M_ptr,&local_1b0,false);
              bVar5 = Track::is_mixed_encoding(this);
              if (bVar5) {
                peVar21 = (exception *)__cxa_allocate_exception(0x10);
                util::exception::exception<CylHead&,char_const(&)[46]>
                          (peVar21,&local_1b0,
                           (char (*) [46])" is mixed-density, which EDSK doesn\'t support");
                __cxa_throw(peVar21,&util::exception::typeinfo,std::runtime_error::~runtime_error);
              }
              uVar11 = this->tracklen;
              uVar13 = uVar11 + 0xf;
              if (-1 < (int)uVar11) {
                uVar13 = uVar11;
              }
              local_178._0_2_ = (undefined2)(uVar13 >> 4);
              if (local_228.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                  _M_impl.super__Vector_impl_data._M_finish ==
                  local_228.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage) {
                std::vector<unsigned_short,_std::allocator<unsigned_short>_>::
                _M_realloc_insert<unsigned_short>
                          (&local_228,
                           (iterator)
                           local_228.
                           super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                           _M_impl.super__Vector_impl_data._M_finish,(unsigned_short *)local_178);
              }
              else {
                *local_228.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                 _M_impl.super__Vector_impl_data._M_finish = local_178._0_2_;
                local_228.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                _M_impl.super__Vector_impl_data._M_finish =
                     local_228.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                     _M_impl.super__Vector_impl_data._M_finish + 1;
              }
              local_238 = (char *)0x0;
              uStack_230._0_4_ = 0;
              uStack_230._4_4_ = 0;
              Sector::Sector(&local_208,Unknown,Unknown,(Header *)&local_238,0);
              GetTypicalSector((Sector *)local_178,&local_1b0,this,&local_208);
              std::vector<Data,_std::allocator<Data>_>::~vector(&local_208.m_data);
              iVar10 = Track::size(this);
              local_1b8 = iVar10 * 8 + 0x117U & 0xffffff00;
              local_1c0 = (uint8_t *)(long)(int)local_1b8;
              sVar20 = 0;
              if (local_1b8 != 0) {
                sVar20 = (long)local_1c0 - 0xd;
              }
              memset(local_190,0,sVar20);
              local_260[0] = 'T';
              local_260[1] = 'r';
              local_260[2] = 'a';
              local_260[3] = 'c';
              local_260[4] = 'k';
              local_260[5] = '-';
              local_260[6] = 'I';
              local_260[7] = 'n';
              local_260[5] = '-';
              local_260[6] = 'I';
              local_260[7] = 'n';
              local_260[8] = 'f';
              local_260[9] = 'o';
              local_260[10] = '\r';
              local_260[0xb] = '\n';
              local_260[0xc] = '\0';
              local_260[0x10] = (uint8_t)local_254;
              local_260[0x11] = (uint8_t)local_24c;
              iVar10 = Track::size(this);
              local_260[0x15] = (uint8_t)iVar10;
              local_260[0x17] = 0xe5;
              iVar12 = Track::size(this);
              iVar10 = 2;
              if (iVar12 != 0) {
                iVar10 = local_178._12_4_;
              }
              local_260[0x14] = (uint8_t)iVar10;
              uVar6 = (uint8_t)local_178._28_4_;
              if (local_178._28_4_ == 0) {
                uVar6 = 'N';
              }
              local_260[0x16] = uVar6;
              iVar10 = Track::size(this);
              if (iVar10 == 0) {
                datarate = Unknown;
              }
              else {
                pSVar16 = Track::operator[](this,0);
                datarate = pSVar16->datarate;
              }
              iVar10 = Track::size(this);
              if (iVar10 == 0) {
                bVar5 = false;
              }
              else {
                pSVar16 = Track::operator[](this,0);
                bVar5 = pSVar16->encoding == FM;
              }
              if ((int)datarate < 500000) {
                if ((datarate == _250K) || (datarate == _300K)) {
                  local_260[0x12] = '\x01';
                }
                else {
LAB_0018dcda:
                  local_260[0x12] = '\0';
                }
              }
              else if (datarate == _500K) {
                local_260[0x12] = '\x02';
              }
              else {
                if (datarate != _1M) goto LAB_0018dcda;
                local_260[0x12] = '\x03';
              }
              local_260[0x13] = bVar5;
              iVar10 = opt.legacy;
              local_264 = 0;
              iVar12 = GetUnformatSizeCode(datarate);
              local_244 = Sector::SizeCodeToLength(iVar12);
              bVar5 = iVar10 != 0;
              local_1c0 = local_260 + (long)local_1c0;
              local_248 = 0;
              local_23c = 0;
              local_240 = 0;
              local_210 = this;
              do {
                iVar10 = Track::size(this);
                if (iVar10 == 0) break;
                local_264 = local_1b8;
                puVar19 = local_260;
                if (local_260[0x15] != '\0') {
                  puVar25 = (uint8_t *)0x0;
                  __dest = local_1c0;
                  do {
                    local_180 = puVar25;
                    pSVar16 = Track::operator[](this,(int)puVar25);
                    uVar1 = *(undefined4 *)((long)&pSVar16->gap3 + 3);
                    local_208.dam = (uint8_t)((uint)uVar1 >> 8);
                    local_208._33_2_ = SUB42((uint)uVar1 >> 0x10,0);
                    local_208.header.cyl = (pSVar16->header).cyl;
                    local_208.header.head = (pSVar16->header).head;
                    local_208.header.sector = (pSVar16->header).sector;
                    local_208.header.size = (pSVar16->header).size;
                    local_208.datarate = pSVar16->datarate;
                    local_208.encoding = pSVar16->encoding;
                    uVar3 = pSVar16->offset;
                    uVar4 = pSVar16->gap3;
                    local_208.offset = uVar3;
                    local_208.gap3 = uVar4;
                    std::vector<Data,_std::allocator<Data>_>::vector
                              (&local_208.m_data,&pSVar16->m_data);
                    bVar24 = local_266;
                    if (local_208.offset == 0U) {
                      bVar24 = 0;
                    }
                    if (local_208.offset != 0U && (local_248 & 1) == 0) {
                      uVar11 = local_208.offset + 0xf;
                      if (-1 < local_208.offset) {
                        uVar11 = local_208.offset;
                      }
                      uVar23 = (unsigned_short)(uVar11 >> 4);
                      local_238 = (char *)CONCAT62(local_238._2_6_,uVar23);
                      if (local_228.
                          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                          _M_impl.super__Vector_impl_data._M_finish ==
                          local_228.
                          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage) {
                        std::vector<unsigned_short,_std::allocator<unsigned_short>_>::
                        _M_realloc_insert<unsigned_short>
                                  (&local_228,
                                   (iterator)
                                   local_228.
                                   super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                   ._M_impl.super__Vector_impl_data._M_finish,
                                   (unsigned_short *)&local_238);
                        bVar24 = local_266;
                      }
                      else {
                        *local_228.
                         super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl
                         .super__Vector_impl_data._M_finish = uVar23;
                        local_228.
                        super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                        super__Vector_impl_data._M_finish =
                             local_228.
                             super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                             _M_impl.super__Vector_impl_data._M_finish + 1;
                        bVar24 = local_266;
                      }
                    }
                    local_266 = bVar24;
                    iVar10 = 200000;
                    if (local_208.datarate == _300K) {
                      iVar10 = 0x28b0b;
                    }
                    iVar10 = GetTrackCapacity(iVar10,local_208.datarate,local_208.encoding);
                    if ((local_208.dam != 0xf8) && (local_208.dam != 0xfb)) {
                      local_238 = CHR(local_254,local_24c,local_208.header.sector);
                      Message<char_const*,unsigned_char&>
                                (msgWarning,"discarding data from %s due to non-standard DAM %02x",
                                 &local_238,&local_208.dam);
                      Sector::remove_data(&local_208);
                    }
                    local_24d = Sector::has_badidcrc(&local_208);
                    bVar7 = Sector::has_badidcrc(&local_208);
                    if (bVar7) {
                      bVar7 = false;
                    }
                    else {
                      bVar7 = Sector::has_data(&local_208);
                      bVar7 = !bVar7;
                    }
                    bVar8 = Sector::has_baddatacrc(&local_208);
                    bVar9 = Sector::is_deleted(&local_208);
                    bVar24 = bVar7 | 0x20;
                    if (!bVar8) {
                      bVar24 = bVar7;
                    }
                    bVar2 = bVar24 + 0x40;
                    if (!bVar9) {
                      bVar2 = bVar24;
                    }
                    local_1b4 = (uint)bVar2;
                    iVar12 = Sector::copies(&local_208);
                    uVar13 = Sector::data_size(&local_208);
                    uVar14 = Sector::size(&local_208);
                    uVar11 = local_244;
                    if ((int)uVar13 < (int)local_244) {
                      uVar11 = uVar13;
                    }
                    if (local_208.header.size < 8) {
                      uVar11 = uVar13;
                    }
                    if ((1 < iVar12) && (bVar7 = Track::is_8k_sector(local_210), bVar7)) {
                      uVar11 = uVar14;
                    }
                    if ((iVar12 < 2) || (uVar11 == uVar14)) {
                      if ((iVar10 < (int)uVar11) && (bVar7 = Track::is_8k_sector(local_210), !bVar7)
                         ) {
                        iVar12 = 1;
                      }
                    }
                    else if ((int)uVar14 < (int)uVar11) {
                      local_238 = CHR(local_254,local_24c,local_208.header.sector);
                      Message<char_const*>
                                (msgWarning,"discarding gaps from multiple copies of %s",&local_238)
                      ;
                      uVar11 = uVar14;
                    }
                    else {
                      uVar11 = uVar14;
                      if ((local_208.offset != 0) &&
                         ((int)(local_208.offset + uVar14) < local_210->tracklen)) {
                        local_238 = CHR(local_254,local_24c,local_208.header.sector);
                        Message<char_const*>
                                  (msgWarning,"short data field in multiple copies of %s",&local_238
                                  );
                      }
                    }
                    if ((local_23c & 1) != 0) {
                      bVar7 = Sector::has_baddatacrc(&local_208);
                      iVar10 = 1;
                      if (iVar12 < 1) {
                        iVar10 = iVar12;
                      }
                      if (bVar7) {
                        iVar12 = iVar10;
                      }
                    }
                    if ((local_240 & 1) != 0) {
                      bVar7 = Sector::has_baddatacrc(&local_208);
                      uVar13 = local_244;
                      if ((int)uVar11 < (int)local_244) {
                        uVar13 = uVar11;
                      }
                      if (bVar7) {
                        uVar11 = uVar13;
                      }
                    }
                    if (bVar5) {
                      if (0 < iVar12) {
                        iVar12 = 1;
                      }
                      uVar13 = 0x1800;
                      if ((int)uVar11 < 0x1800) {
                        uVar13 = uVar11;
                      }
                      if (local_208.header.size != 6) {
                        uVar13 = uVar11;
                      }
                      if (6 < local_208.header.size) {
                        uVar13 = 0;
                      }
                      uVar11 = uVar13;
                      if ((int)uVar14 <= (int)uVar13) {
                        uVar11 = uVar14;
                      }
                    }
                    if (0 < iVar12) {
                      iVar10 = 0;
                      do {
                        pDVar17 = Sector::data_copy(&local_208,iVar10);
                        if ((int)(local_264 + uVar11) < 0xff00) {
                          __src = (pDVar17->
                                  super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start;
                          iVar15 = (int)(pDVar17->
                                        super_vector<unsigned_char,_std::allocator<unsigned_char>_>)
                                        .
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_finish - (int)__src;
                          if (iVar15 < (int)uVar11) {
                            memcpy(__dest,__src,(long)iVar15);
                            iVar15 = (int)(pDVar17->
                                          super_vector<unsigned_char,_std::allocator<unsigned_char>_>
                                          ).
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                     (int)(pDVar17->
                                          super_vector<unsigned_char,_std::allocator<unsigned_char>_>
                                          ).
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data._M_start;
                            memset(__dest + iVar15,0,(long)(int)(uVar11 - iVar15));
                          }
                          else {
                            memcpy(__dest,__src,(long)(int)uVar11);
                          }
                          if (uVar11 == 0) {
                            uVar11 = 0;
                          }
                          else {
                            iVar15 = Sector::copies(&local_208);
                            if (((iVar15 == 1) &&
                                (bVar7 = Sector::has_baddatacrc(&local_208),
                                bVar7 && uVar11 != uVar14)) && ((int)uVar11 % (int)uVar14 == 0)) {
                              lVar18 = (long)(int)uVar11;
                              uVar11 = uVar11 + 1;
                              __dest[lVar18] = '{';
                            }
                          }
                        }
                        local_264 = local_264 + uVar11;
                        __dest = __dest + (int)uVar11;
                        iVar10 = iVar10 + 1;
                      } while (iVar12 != iVar10);
                    }
                    puVar25 = local_180;
                    puVar19 = local_260;
                    local_260[(long)local_180 * 8 + 0x18] = (uint8_t)local_208.header.cyl;
                    local_260[(long)local_180 * 8 + 0x19] = (uint8_t)local_208.header.head;
                    local_260[(long)local_180 * 8 + 0x1a] = (uint8_t)local_208.header.sector;
                    local_260[(long)local_180 * 8 + 0x1b] = (uint8_t)local_208.header.size;
                    local_260[(long)local_180 * 8 + 0x1c] = (local_24d | bVar8) << 5;
                    local_260[(long)local_180 * 8 + 0x1d] = (uint8_t)local_1b4;
                    local_260[(long)local_180 * 8 + 0x1e] = (uint8_t)(uVar11 * iVar12);
                    local_260[(long)local_180 * 8 + 0x1f] = (uint8_t)(uVar11 * iVar12 >> 8);
                    std::vector<Data,_std::allocator<Data>_>::~vector(&local_208.m_data);
                    puVar25 = puVar25 + 1;
                    puVar19 = (uint8_t *)(ulong)puVar19[0x15];
                    this = local_210;
                  } while (puVar25 < puVar19);
                }
                f_ = (FILE *)local_188;
                uVar11 = local_264;
                lVar18 = (long)(int)local_264;
                bVar7 = bVar5;
                if (lVar18 < 0xff01) {
                  memset(local_260 + lVar18,0,0xff00 - lVar18);
                  uVar13 = local_23c;
                }
                else {
                  uVar22 = (undefined7)((ulong)puVar19 >> 8);
                  local_248 = (uint)CONCAT71(uVar22,1);
                  uVar13 = (uint)CONCAT71(uVar22,1);
                  if ((local_23c & 1) != 0) {
                    local_248 = uVar13;
                    uVar13 = local_23c;
                    if ((local_240 & 1) == 0) {
                      local_240 = (uint)CONCAT71(uVar22,1);
                    }
                    else if ((int)local_244 < 0x81) {
                      local_248 = (uint)CONCAT71((uint7)(uint3)(local_244 >> 8),1);
                      bVar7 = true;
                      if (bVar5) {
                        peVar21 = (exception *)__cxa_allocate_exception(0x10);
                        local_208.header.cyl = 0xff00;
                        util::exception::
                        exception<CylHead&,char_const(&)[8],int&,char_const(&)[29],int,char_const(&)[2]>
                                  (peVar21,&local_1b0,(char (*) [8])0x1b2e1d,(int *)&local_264,
                                   (char (*) [29])") exceeds EDSK track limit (",(int *)&local_208,
                                   (char (*) [2])0x1aefa0);
                        __cxa_throw(peVar21,&util::exception::typeinfo,
                                    std::runtime_error::~runtime_error);
                      }
                    }
                    else {
                      local_244 = local_244 >> 1;
                    }
                  }
                }
                bVar5 = bVar7;
                local_23c = uVar13;
                disk = local_198;
              } while (0xff00 < (int)uVar11);
              *local_1a0 = (char)(local_264 + 0xff >> 8);
              local_264 = local_264 + 0xff & 0xffffff00;
              local_1a0 = local_1a0 + 1;
              fwrite(local_260,(long)(int)local_264,1,(FILE *)f_);
              std::vector<Data,_std::allocator<Data>_>::~vector(&local_150);
              uVar11 = local_24c + 1;
            } while (local_24c + 1 < (uint)local_107);
          }
          local_254 = local_254 + 1;
        } while (local_254 < local_108);
        local_1a8 = (ulong)(local_266 ^ 1);
      }
      if ((opt.legacy == 0) && ((local_1a8 & 1) == 0)) {
        local_178._8_4_ = 0xd6f666e;
        local_178._12_3_ = 10;
        local_178._0_2_ = 0x664f;
        local_178._2_5_ = 0x2d74657366;
        local_178[7] = 0x49;
        fwrite(local_178,0xf,1,(FILE *)f_);
        fwrite(local_228.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl
               .super__Vector_impl_data._M_start,
               (long)local_228.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)local_228.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                     _M_impl.super__Vector_impl_data._M_start >> 1,2,(FILE *)f_);
      }
      fseek((FILE *)f_,0,0);
      sVar20 = fwrite(local_138,0x100,1,(FILE *)f_);
      if (sVar20 == 0) {
        peVar21 = (exception *)__cxa_allocate_exception(0x10);
        util::exception::exception<char_const(&)[12]>(peVar21,(char (*) [12])"write error");
        __cxa_throw(peVar21,&util::exception::typeinfo,std::runtime_error::~runtime_error);
      }
      fseek((FILE *)f_,0,2);
      if (local_228.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_228.
                        super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_228.
                              super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_228.
                              super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      FreeMem(local_260);
      return true;
    }
    peVar21 = (exception *)__cxa_allocate_exception(0x10);
    util::exception::exception<char_const(&)[24]>(peVar21,(char (*) [24])"too many heads for EDSK");
  }
  else {
    peVar21 = (exception *)__cxa_allocate_exception(0x10);
    util::exception::exception<char_const(&)[28]>
              (peVar21,(char (*) [28])"too many cylinders for EDSK");
  }
  __cxa_throw(peVar21,&util::exception::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

bool WriteDSK(FILE* f_, std::shared_ptr<Disk>& disk)
{
    MEMORY mem(ESDK_MAX_TRACK_SIZE);
    auto pbTrack = mem.pb;

    uint8_t abHeader[256] = {}; // EDSK file header is fixed at 256 bytes - don't change!
    auto peh = reinterpret_cast<EDSK_HEADER*>(abHeader);
    auto pbIndex = reinterpret_cast<uint8_t*>(peh + 1);
    auto max_cyls = (sizeof(abHeader) - sizeof(EDSK_HEADER)) / MAX_SIDES;

    memcpy(peh->szSignature, EDSK_SIGNATURE, sizeof(EDSK_SIGNATURE) - 1);
    strncpy(peh->szCreator, util::fmt("SAMdisk%02u%02u%02u", YEAR % 100, MONTH + 1, DAY).c_str(), sizeof(peh->szCreator));

    peh->bTracks = static_cast<uint8_t>(disk->cyls());
    peh->bSides = static_cast<uint8_t>(disk->heads());

    if (peh->bTracks > max_cyls)
        throw util::exception("too many cylinders for EDSK");
    else if (peh->bSides > MAX_SIDES)
        throw util::exception("too many heads for EDSK");

    bool add_offsets_block = true;
    std::vector<uint16_t> offsets;
    offsets.reserve((peh->bTracks + 1) * peh->bSides);

    fseek(f_, sizeof(abHeader), SEEK_SET);

    for (uint8_t cyl = 0; cyl < peh->bTracks; ++cyl)
    {
        for (uint8_t head = 0; head < peh->bSides; ++head)
        {
            CylHead cylhead(cyl, head);
            auto& track = disk->read_track(cylhead);

            if (track.is_mixed_encoding())
                throw util::exception(cylhead, " is mixed-density, which EDSK doesn't support");

            bool added_sector_offsets = false;
            offsets.push_back(util::htole(static_cast<uint16_t>(track.tracklen / 16)));

            auto pt = reinterpret_cast<EDSK_TRACK*>(mem.pb);
            auto ps = reinterpret_cast<EDSK_SECTOR*>(pt + 1);

            Sector typical = GetTypicalSector(cylhead, track, Sector(DataRate::Unknown, Encoding::Unknown));

            // The standard track header is 256 bytes, but to allow more than 29 sectors we'll
            // round up the required size to the next 256-byte boundary
            int track_header_size = (sizeof(EDSK_TRACK) + track.size() * sizeof(EDSK_SECTOR) + 0xff) & ~0xff;

            memset(mem, 0, track_header_size);
            memcpy(pt->signature, EDSK_TRACK_SIG, sizeof(pt->signature));
            pt->track = cyl;
            pt->side = head;
            pt->sectors = static_cast<uint8_t>(track.size());
            pt->fill = 0xe5;
            pt->size = static_cast<uint8_t>(track.size() ? typical.header.size : EDSK_DEFAULT_SIZE);
            pt->gap3 = static_cast<uint8_t>(typical.gap3 ? typical.gap3 : EDSK_DEFAULT_GAP3);

            auto datarate = track.size() ? track[0].datarate : DataRate::Unknown;
            auto encoding = track.size() ? track[0].encoding : Encoding::Unknown;

            switch (datarate)
            {
            default:                pt->rate = 0;   break;
            case DataRate::_250K:   pt->rate = 1;   break;
            case DataRate::_300K:   pt->rate = 1;   break;
            case DataRate::_500K:   pt->rate = 2;   break;
            case DataRate::_1M:     pt->rate = 3;   break;
            }

            pt->encoding = (encoding == Encoding::FM) ? 1 : 0;

            // Assume 300rpm to determine approximate track capacity
            auto track_size = 0;

            // Space saving flags, to squeeze the track into the limited EDSK space
            bool fFitLegacy = !!opt.legacy;
            bool fFitErrorCopies = false, fFitErrorSize = false;
            auto uFitSize = Sector::SizeCodeToLength(GetUnformatSizeCode(datarate));

            // Loop to fit any sectors
            while (track.size())
            {
                // Start with the size of the track header
                track_size = track_header_size;

                // Point to the start of the data area and the sector space
                auto pb = mem + track_header_size;

                for (int i = 0; i < pt->sectors; ++i)
                {
                    auto sector = track[i];

                    // If any offsets are zero we can't generate append an offsets block.
                    if (!sector.offset)
                        add_offsets_block = false;
                    // Take care to only output offsets on the first pass around the fitting loop.
                    else if (!added_sector_offsets)
                        offsets.push_back(util::htole(static_cast<uint16_t>(sector.offset / 16)));

                    auto rpm_time = (sector.datarate == DataRate::_300K) ? RPM_TIME_360 : RPM_TIME_300;
                    auto track_capacity = GetTrackCapacity(rpm_time, sector.datarate, sector.encoding);

                    // Accept only normal and deleted DAMs, removing the data field for other types.
                    // Hercule II (CPC) has a non-standard DAM (0xFD), and expects it to be unreadable.
                    if (sector.dam != 0xfb && sector.dam != 0xf8)
                    {
                        Message(msgWarning, "discarding data from %s due to non-standard DAM %02x",
                            CHR(cyl, head, sector.header.sector), sector.dam);
                        sector.remove_data();
                    }

                    uint8_t status1 = 0, status2 = 0;
                    if (sector.has_badidcrc()) status1 |= SR1_CRC_ERROR;
                    if (!sector.has_badidcrc() && !sector.has_data()) status2 |= SR2_MISSING_ADDRESS_MARK;
                    if (sector.has_baddatacrc()) { status1 |= SR1_CRC_ERROR; status2 |= SR2_CRC_ERROR_IN_SECTOR_DATA; }
                    if (sector.is_deleted()) status2 |= SR2_SECTOR_WITH_DELETED_DATA;

                    auto num_copies = sector.copies();
                    auto data_size = sector.data_size();
                    auto real_size = sector.size();

                    // Clip extended sizes to the unformat size, to ensure we have a complete revolution
                    if (sector.header.size > 7 && data_size > uFitSize)
                        data_size = uFitSize;

                    // Preserve multiple copies on 8K tracks by extending them to full size
                    if (num_copies > 1 && track.is_8k_sector())
                        data_size = real_size;

                    // Warn if other error sectors are shorter than real size
                    if (num_copies > 1 && data_size != real_size)
                    {
                        if (data_size > real_size)
                            Message(msgWarning, "discarding gaps from multiple copies of %s", CHR(cyl, head, sector.header.sector));
                        else if (sector.offset && sector.offset + real_size < track.tracklen)
                            Message(msgWarning, "short data field in multiple copies of %s", CHR(cyl, head, sector.header.sector));

                        data_size = real_size;
                    }

                    // Drop extra copies on sectors larger than the track, unless it's
                    // an 8K sector with an error during the first 6K of data.
                    else if (data_size > track_capacity && !track.is_8k_sector())
                        num_copies = 1;

                    // Drop any extra copies of error sectors
                    if (fFitErrorCopies)
                    {
                        if (sector.has_baddatacrc() && num_copies > 1)
                            num_copies = 1;
                    }

                    // Cut extended sectors down to zero data
                    if (fFitErrorSize)
                    {
                        if (sector.has_baddatacrc() && data_size > uFitSize)
                            data_size = uFitSize;
                    }

                    // Force to legacy format?
                    if (fFitLegacy)
                    {
                        if (num_copies > 1) num_copies = 1;
                        if (sector.header.size == 6 && data_size > 6144) data_size = 6144;
                        if (sector.header.size >= 7) data_size = 0;
                        if (data_size > real_size) data_size = real_size;
                    }

                    // Copy the sector data into place
                    for (auto copy = 0; copy < num_copies; ++copy)
                    {
                        const Data& data = sector.data_copy(copy);

                        // Only copy if there's room - we'll check it fits later
                        if (track_size + data_size < mem.size)
                        {
                            if (data.size() >= data_size)
                                memcpy(pb, data.data(), data_size);
                            else
                            {
                                // Extend 8K sectors to full size to preserve multiple copies
                                memcpy(pb, data.data(), data.size());
                                memset(pb + data.size(), 0, data_size - data.size());
                            }

                            // Single copy data CRC error and size that conflicts with multiple copies extension?
                            if (data_size && sector.copies() == 1 && sector.has_baddatacrc() &&
                                data_size != real_size && (data_size % real_size) == 0)
                            {
                                // Write a dummy marker byte to the end of the data, and increment the stored size
                                pb[data_size++] = 123;
                            }
                        }

                        pb += data_size;
                        track_size += data_size;
                    }

                    ps[i].track = static_cast<uint8_t>(sector.header.cyl);
                    ps[i].side = static_cast<uint8_t>(sector.header.head);
                    ps[i].sector = static_cast<uint8_t>(sector.header.sector);
                    ps[i].size = static_cast<uint8_t>(sector.header.size);
                    ps[i].status1 = status1;
                    ps[i].status2 = status2;

                    data_size *= num_copies;
                    ps[i].datalow = data_size & 0xff;
                    ps[i].datahigh = static_cast<uint8_t>(data_size >> 8);
                }

                // If the track fits, we're done
                if (track_size <= mem.size)
                {
                    // Clear any unused space, then break out to save it
                    memset(mem + track_size, 0, mem.size - track_size);
                    break;
                }

                // Flag that sector offsets have already been generated.
                added_sector_offsets = true;

                // Try again using various techniques to make it fit
                if (!fFitErrorCopies) { fFitErrorCopies = true; continue; }
                if (!fFitErrorSize) { fFitErrorSize = true; continue; }
                if (uFitSize > 128) { uFitSize /= 2; continue; }
                if (!fFitLegacy) { fFitLegacy = true; continue; }

                // If we run out of methods, fail
                throw util::exception(cylhead, " size (", track_size, ") exceeds EDSK track limit (", ESDK_MAX_TRACK_SIZE, ")");
            }

            // Round the size up to the next 256-byte boundary, and store the MSB in the index
            track_size = (track_size + 0xff) & ~0xff;
            *pbIndex++ = static_cast<uint8_t>(track_size >> 8);

            // Write the track to the image
            fwrite(pbTrack, track_size, 1, f_);
        }
    }

    // Add offsets if available, unless they're disabled
    if (!opt.legacy && add_offsets_block)
    {
        EDSK_OFFSETS eo = { EDSK_OFFSETS_SIG, 0 };
        fwrite(&eo, sizeof(eo), 1, f_);
        fwrite(offsets.data(), offsets.size(), sizeof(uint16_t), f_);
    }

    fseek(f_, 0, SEEK_SET);
    if (!fwrite(abHeader, sizeof(abHeader), 1, f_))
        throw util::exception("write error");
    fseek(f_, 0, SEEK_END);

    return true;
}